

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

SRCINFO * __thiscall Js::ScriptContext::AddHostSrcInfo(ScriptContext *this,SRCINFO *pSrcInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  SRCINFO *this_00;
  TrackAllocData local_40;
  SRCINFO *local_18;
  SRCINFO *pSrcInfo_local;
  ScriptContext *this_local;
  
  local_18 = pSrcInfo;
  pSrcInfo_local = (SRCINFO *)this;
  if (pSrcInfo == (SRCINFO *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x3cf,"(pSrcInfo != nullptr)","pSrcInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&SRCINFO::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
             ,0x3d1);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_40);
  this_00 = (SRCINFO *)new<Memory::Recycler>(0x28,pRVar4,0x744a10);
  SRCINFO::SRCINFO(this_00,local_18);
  return this_00;
}

Assistant:

SRCINFO *ScriptContext::AddHostSrcInfo(SRCINFO const *pSrcInfo)
    {
        Assert(pSrcInfo != nullptr);

        return RecyclerNewZ(this->GetRecycler(), SRCINFO, *pSrcInfo);
    }